

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_iterator.cpp
# Opt level: O0

void __thiscall
duckdb::BoundNodeVisitor::VisitBoundQueryNode(BoundNodeVisitor *this,BoundQueryNode *node)

{
  ulong uVar1;
  bool bVar2;
  type pBVar3;
  type pBVar4;
  undefined8 uVar5;
  size_type sVar6;
  pointer pBVar7;
  BoundDistinctModifier *pBVar8;
  BoundOrderModifier *pBVar9;
  BoundLimitModifier *pBVar10;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *puVar11;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *puVar12;
  long in_RSI;
  long *in_RDI;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *offset_expr;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *limit_expr;
  BoundOrderByNode *order;
  iterator __end3_6;
  iterator __begin3_6;
  vector<duckdb::BoundOrderByNode,_true> *__range3_6;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expr_5;
  iterator __end3_5;
  iterator __begin3_5;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *__range3_5;
  idx_t i;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expr_4;
  iterator __end3_4;
  iterator __begin3_4;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *__range3_4;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expr_3;
  iterator __end4;
  iterator __begin4;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *__range4;
  pair<const_unsigned_long,_duckdb::BoundUnnestNode> *entry;
  iterator __end3_3;
  iterator __begin3_3;
  unordered_map<unsigned_long,_duckdb::BoundUnnestNode,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BoundUnnestNode>_>_>
  *__range3_3;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expr_2;
  iterator __end3_2;
  iterator __begin3_2;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *__range3_2;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expr_1;
  iterator __end3_1;
  iterator __begin3_1;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *__range3_1;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expr;
  iterator __end3;
  iterator __begin3;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *__range3;
  BoundSelectNode *bound_select;
  BoundCTENode *cte_node_1;
  BoundRecursiveCTENode *cte_node;
  BoundSetOperationNode *bound_setop;
  string *in_stack_fffffffffffffe48;
  undefined7 in_stack_fffffffffffffe50;
  ResultModifierType in_stack_fffffffffffffe57;
  BoundQueryNode *in_stack_fffffffffffffe90;
  __normal_iterator<duckdb::BoundOrderByNode_*,_std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>_>
  local_160;
  vector<duckdb::BoundOrderByNode,_true> *local_158;
  reference local_150;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *local_148;
  __normal_iterator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
  local_140;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *local_138;
  ulong local_130;
  undefined1 local_125;
  allocator local_111;
  string local_110 [32];
  reference local_f0;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *local_e8;
  __normal_iterator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
  local_e0;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *local_d8;
  reference local_d0;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *local_c8;
  __normal_iterator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
  local_c0;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *local_b8;
  reference local_b0;
  _Node_iterator_base<std::pair<const_unsigned_long,_duckdb::BoundUnnestNode>,_false> local_a8;
  _Node_iterator_base<std::pair<const_unsigned_long,_duckdb::BoundUnnestNode>,_false> local_a0;
  unordered_map<unsigned_long,_duckdb::BoundUnnestNode,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BoundUnnestNode>_>_>
  *local_98;
  reference local_90;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *local_88;
  __normal_iterator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
  local_80;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *local_78;
  reference local_70;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *local_68;
  __normal_iterator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
  local_60;
  BoundGroupByNode *local_58;
  reference local_50;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *local_48;
  __normal_iterator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
  local_40;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *local_38;
  BoundSelectNode *local_30;
  BoundCTENode *local_28;
  BoundRecursiveCTENode *local_20;
  BoundSetOperationNode *local_18;
  long local_10;
  
  local_10 = in_RSI;
  switch(*(undefined1 *)(in_RSI + 8)) {
  case 1:
    local_30 = BoundQueryNode::Cast<duckdb::BoundSelectNode>(in_stack_fffffffffffffe90);
    local_38 = &local_30->select_list;
    local_40._M_current =
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
         ::std::
         vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
         ::begin((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  *)in_stack_fffffffffffffe48);
    local_48 = (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               ::std::
               vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               ::end((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                      *)in_stack_fffffffffffffe48);
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
                               *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
                              (__normal_iterator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
                               *)in_stack_fffffffffffffe48), bVar2) {
      local_50 = __gnu_cxx::
                 __normal_iterator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
                 ::operator*(&local_40);
      (**(code **)(*in_RDI + 0x20))(in_RDI,local_50);
      __gnu_cxx::
      __normal_iterator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
      ::operator++(&local_40);
    }
    bVar2 = ::std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_> *)
                       0xe6ef92);
    if (bVar2) {
      (**(code **)(*in_RDI + 0x20))(in_RDI,&local_30->where_clause);
    }
    local_58 = &local_30->groups;
    local_60._M_current =
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
         ::std::
         vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
         ::begin((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  *)in_stack_fffffffffffffe48);
    local_68 = (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               ::std::
               vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               ::end((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                      *)in_stack_fffffffffffffe48);
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
                               *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
                              (__normal_iterator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
                               *)in_stack_fffffffffffffe48), bVar2) {
      local_70 = __gnu_cxx::
                 __normal_iterator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
                 ::operator*(&local_60);
      (**(code **)(*in_RDI + 0x20))(in_RDI,local_70);
      __gnu_cxx::
      __normal_iterator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
      ::operator++(&local_60);
    }
    bVar2 = ::std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_> *)
                       0xe6f058);
    if (bVar2) {
      (**(code **)(*in_RDI + 0x20))(in_RDI,&local_30->having);
    }
    local_78 = &local_30->aggregates;
    local_80._M_current =
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
         ::std::
         vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
         ::begin((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  *)in_stack_fffffffffffffe48);
    local_88 = (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               ::std::
               vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               ::end((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                      *)in_stack_fffffffffffffe48);
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
                               *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
                              (__normal_iterator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
                               *)in_stack_fffffffffffffe48), bVar2) {
      local_90 = __gnu_cxx::
                 __normal_iterator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
                 ::operator*(&local_80);
      (**(code **)(*in_RDI + 0x20))(in_RDI,local_90);
      __gnu_cxx::
      __normal_iterator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
      ::operator++(&local_80);
    }
    local_98 = &local_30->unnests;
    local_a0._M_cur =
         (__node_type *)
         ::std::
         unordered_map<unsigned_long,_duckdb::BoundUnnestNode,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BoundUnnestNode>_>_>
         ::begin((unordered_map<unsigned_long,_duckdb::BoundUnnestNode,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BoundUnnestNode>_>_>
                  *)in_stack_fffffffffffffe48);
    local_a8._M_cur =
         (__node_type *)
         ::std::
         unordered_map<unsigned_long,_duckdb::BoundUnnestNode,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BoundUnnestNode>_>_>
         ::end((unordered_map<unsigned_long,_duckdb::BoundUnnestNode,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BoundUnnestNode>_>_>
                *)in_stack_fffffffffffffe48);
    while (bVar2 = ::std::__detail::operator!=(&local_a0,&local_a8), bVar2) {
      local_b0 = ::std::__detail::
                 _Node_iterator<std::pair<const_unsigned_long,_duckdb::BoundUnnestNode>,_false,_false>
                 ::operator*((_Node_iterator<std::pair<const_unsigned_long,_duckdb::BoundUnnestNode>,_false,_false>
                              *)0xe6f175);
      local_b8 = &(local_b0->second).expressions;
      local_c0._M_current =
           (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
           ::std::
           vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ::begin((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                    *)in_stack_fffffffffffffe48);
      local_c8 = (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 ::std::
                 vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 ::end((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                        *)in_stack_fffffffffffffe48);
      while (bVar2 = __gnu_cxx::operator!=
                               ((__normal_iterator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
                                 *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
                                (__normal_iterator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
                                 *)in_stack_fffffffffffffe48), bVar2) {
        local_d0 = __gnu_cxx::
                   __normal_iterator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
                   ::operator*(&local_c0);
        (**(code **)(*in_RDI + 0x20))(in_RDI,local_d0);
        __gnu_cxx::
        __normal_iterator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
        ::operator++(&local_c0);
      }
      ::std::__detail::
      _Node_iterator<std::pair<const_unsigned_long,_duckdb::BoundUnnestNode>,_false,_false>::
      operator++((_Node_iterator<std::pair<const_unsigned_long,_duckdb::BoundUnnestNode>,_false,_false>
                  *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50));
    }
    local_d8 = &local_30->windows;
    local_e0._M_current =
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
         ::std::
         vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
         ::begin((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  *)in_stack_fffffffffffffe48);
    local_e8 = (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               ::std::
               vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               ::end((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                      *)in_stack_fffffffffffffe48);
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
                               *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
                              (__normal_iterator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
                               *)in_stack_fffffffffffffe48), bVar2) {
      local_f0 = __gnu_cxx::
                 __normal_iterator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
                 ::operator*(&local_e0);
      (**(code **)(*in_RDI + 0x20))(in_RDI,local_f0);
      __gnu_cxx::
      __normal_iterator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
      ::operator++(&local_e0);
    }
    bVar2 = ::std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>
                        *)0xe6f2cb);
    if (bVar2) {
      pBVar4 = unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true>::
               operator*((unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true>
                          *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50));
      (**(code **)(*in_RDI + 0x18))(in_RDI,pBVar4);
    }
    break;
  case 2:
    local_18 = BoundQueryNode::Cast<duckdb::BoundSetOperationNode>(in_stack_fffffffffffffe90);
    pBVar3 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>::
             operator*((unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
                        *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50));
    (**(code **)(*in_RDI + 0x10))(in_RDI,pBVar3);
    pBVar3 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>::
             operator*((unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
                        *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50));
    (**(code **)(*in_RDI + 0x10))(in_RDI,pBVar3);
    break;
  default:
    local_125 = 1;
    uVar5 = __cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_110,"Unimplemented query node in ExpressionIterator",&local_111);
    NotImplementedException::NotImplementedException
              ((NotImplementedException *)
               CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
               in_stack_fffffffffffffe48);
    local_125 = 0;
    __cxa_throw(uVar5,&NotImplementedException::typeinfo,
                NotImplementedException::~NotImplementedException);
  case 4:
    local_20 = BoundQueryNode::Cast<duckdb::BoundRecursiveCTENode>(in_stack_fffffffffffffe90);
    pBVar3 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>::
             operator*((unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
                        *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50));
    (**(code **)(*in_RDI + 0x10))(in_RDI,pBVar3);
    pBVar3 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>::
             operator*((unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
                        *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50));
    (**(code **)(*in_RDI + 0x10))(in_RDI,pBVar3);
    break;
  case 5:
    local_28 = BoundQueryNode::Cast<duckdb::BoundCTENode>(in_stack_fffffffffffffe90);
    pBVar3 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>::
             operator*((unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
                        *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50));
    (**(code **)(*in_RDI + 0x10))(in_RDI,pBVar3);
    pBVar3 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>::
             operator*((unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
                        *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50));
    (**(code **)(*in_RDI + 0x10))(in_RDI,pBVar3);
  }
  for (local_130 = 0; uVar1 = local_130,
      sVar6 = ::std::
              vector<duckdb::unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>_>_>
              ::size((vector<duckdb::unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>_>_>
                      *)(local_10 + 0x10)), uVar1 < sVar6; local_130 = local_130 + 1) {
    vector<duckdb::unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>,_true>
    ::operator[]((vector<duckdb::unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>,_true>
                  *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
                 (size_type)in_stack_fffffffffffffe48);
    pBVar7 = unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>
             ::operator->((unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>
                           *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50));
    in_stack_fffffffffffffe57 = pBVar7->type;
    if (in_stack_fffffffffffffe57 == LIMIT_MODIFIER) {
      vector<duckdb::unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>,_true>
      ::operator[]((vector<duckdb::unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>,_true>
                    *)CONCAT17(1,in_stack_fffffffffffffe50),(size_type)in_stack_fffffffffffffe48);
      unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>
      ::operator->((unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>
                    *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50));
      pBVar10 = BoundResultModifier::Cast<duckdb::BoundLimitModifier>
                          ((BoundResultModifier *)in_stack_fffffffffffffe90);
      puVar11 = BoundLimitNode::GetExpression(&pBVar10->limit_val);
      vector<duckdb::unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>,_true>
      ::operator[]((vector<duckdb::unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>,_true>
                    *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
                   (size_type)in_stack_fffffffffffffe48);
      unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>
      ::operator->((unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>
                    *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50));
      pBVar10 = BoundResultModifier::Cast<duckdb::BoundLimitModifier>
                          ((BoundResultModifier *)in_stack_fffffffffffffe90);
      puVar12 = BoundLimitNode::GetExpression(&pBVar10->offset_val);
      bVar2 = ::std::unique_ptr::operator_cast_to_bool
                        ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_> *
                         )0xe6f612);
      if (bVar2) {
        (**(code **)(*in_RDI + 0x20))(in_RDI,puVar11);
      }
      bVar2 = ::std::unique_ptr::operator_cast_to_bool
                        ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_> *
                         )0xe6f632);
      if (bVar2) {
        (**(code **)(*in_RDI + 0x20))(in_RDI,puVar12);
      }
    }
    else if (in_stack_fffffffffffffe57 == ORDER_MODIFIER) {
      vector<duckdb::unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>,_true>
      ::operator[]((vector<duckdb::unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>,_true>
                    *)CONCAT17(2,in_stack_fffffffffffffe50),(size_type)in_stack_fffffffffffffe48);
      unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>
      ::operator->((unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>
                    *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50));
      pBVar9 = BoundResultModifier::Cast<duckdb::BoundOrderModifier>
                         ((BoundResultModifier *)in_stack_fffffffffffffe90);
      local_158 = &pBVar9->orders;
      local_160._M_current =
           (BoundOrderByNode *)
           ::std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>::begin
                     ((vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_> *
                      )in_stack_fffffffffffffe48);
      ::std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>::end
                ((vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_> *)
                 in_stack_fffffffffffffe48);
      while (bVar2 = __gnu_cxx::operator!=
                               ((__normal_iterator<duckdb::BoundOrderByNode_*,_std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>_>
                                 *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
                                (__normal_iterator<duckdb::BoundOrderByNode_*,_std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>_>
                                 *)in_stack_fffffffffffffe48), bVar2) {
        in_stack_fffffffffffffe90 =
             (BoundQueryNode *)
             __gnu_cxx::
             __normal_iterator<duckdb::BoundOrderByNode_*,_std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>_>
             ::operator*(&local_160);
        (**(code **)(*in_RDI + 0x20))
                  (in_RDI,(unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                           *)&in_stack_fffffffffffffe90->type);
        __gnu_cxx::
        __normal_iterator<duckdb::BoundOrderByNode_*,_std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>_>
        ::operator++(&local_160);
      }
    }
    else if (in_stack_fffffffffffffe57 == DISTINCT_MODIFIER) {
      vector<duckdb::unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>,_true>
      ::operator[]((vector<duckdb::unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>,_true>
                    *)CONCAT17(3,in_stack_fffffffffffffe50),(size_type)in_stack_fffffffffffffe48);
      unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>
      ::operator->((unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>
                    *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50));
      pBVar8 = BoundResultModifier::Cast<duckdb::BoundDistinctModifier>
                         ((BoundResultModifier *)in_stack_fffffffffffffe90);
      local_138 = &pBVar8->target_distincts;
      local_140._M_current =
           (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
           ::std::
           vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ::begin((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                    *)in_stack_fffffffffffffe48);
      local_148 = (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                  ::std::
                  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  ::end((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                         *)in_stack_fffffffffffffe48);
      while (bVar2 = __gnu_cxx::operator!=
                               ((__normal_iterator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
                                 *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
                                (__normal_iterator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
                                 *)in_stack_fffffffffffffe48), bVar2) {
        local_150 = __gnu_cxx::
                    __normal_iterator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
                    ::operator*(&local_140);
        (**(code **)(*in_RDI + 0x20))(in_RDI,local_150);
        __gnu_cxx::
        __normal_iterator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
        ::operator++(&local_140);
      }
    }
  }
  return;
}

Assistant:

void BoundNodeVisitor::VisitBoundQueryNode(BoundQueryNode &node) {
	switch (node.type) {
	case QueryNodeType::SET_OPERATION_NODE: {
		auto &bound_setop = node.Cast<BoundSetOperationNode>();
		VisitBoundQueryNode(*bound_setop.left);
		VisitBoundQueryNode(*bound_setop.right);
		break;
	}
	case QueryNodeType::RECURSIVE_CTE_NODE: {
		auto &cte_node = node.Cast<BoundRecursiveCTENode>();
		VisitBoundQueryNode(*cte_node.left);
		VisitBoundQueryNode(*cte_node.right);
		break;
	}
	case QueryNodeType::CTE_NODE: {
		auto &cte_node = node.Cast<BoundCTENode>();
		VisitBoundQueryNode(*cte_node.child);
		VisitBoundQueryNode(*cte_node.query);
		break;
	}
	case QueryNodeType::SELECT_NODE: {
		auto &bound_select = node.Cast<BoundSelectNode>();
		for (auto &expr : bound_select.select_list) {
			VisitExpression(expr);
		}
		if (bound_select.where_clause) {
			VisitExpression(bound_select.where_clause);
		}
		for (auto &expr : bound_select.groups.group_expressions) {
			VisitExpression(expr);
		}
		if (bound_select.having) {
			VisitExpression(bound_select.having);
		}
		for (auto &expr : bound_select.aggregates) {
			VisitExpression(expr);
		}
		for (auto &entry : bound_select.unnests) {
			for (auto &expr : entry.second.expressions) {
				VisitExpression(expr);
			}
		}
		for (auto &expr : bound_select.windows) {
			VisitExpression(expr);
		}
		if (bound_select.from_table) {
			VisitBoundTableRef(*bound_select.from_table);
		}
		break;
	}
	default:
		throw NotImplementedException("Unimplemented query node in ExpressionIterator");
	}
	for (idx_t i = 0; i < node.modifiers.size(); i++) {
		switch (node.modifiers[i]->type) {
		case ResultModifierType::DISTINCT_MODIFIER:
			for (auto &expr : node.modifiers[i]->Cast<BoundDistinctModifier>().target_distincts) {
				VisitExpression(expr);
			}
			break;
		case ResultModifierType::ORDER_MODIFIER:
			for (auto &order : node.modifiers[i]->Cast<BoundOrderModifier>().orders) {
				VisitExpression(order.expression);
			}
			break;
		case ResultModifierType::LIMIT_MODIFIER: {
			auto &limit_expr = node.modifiers[i]->Cast<BoundLimitModifier>().limit_val.GetExpression();
			auto &offset_expr = node.modifiers[i]->Cast<BoundLimitModifier>().offset_val.GetExpression();
			if (limit_expr) {
				VisitExpression(limit_expr);
			}
			if (offset_expr) {
				VisitExpression(offset_expr);
			}
			break;
		}
		default:
			break;
		}
	}
}